

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int gen_publickey_from_rsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  uchar **ppuVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  size_t sVar6;
  uchar *puVar7;
  uchar *buf;
  BIGNUM *e;
  BIGNUM *local_60;
  uchar **local_58;
  size_t *local_50;
  size_t *local_48;
  uchar **local_40;
  BIGNUM *local_38;
  
  local_40 = method;
  puVar5 = (uchar *)(*session->alloc)(7,&session->abstract);
  if (puVar5 == (uchar *)0x0) {
    puVar5 = (uchar *)0x0;
  }
  else {
    buf = (uchar *)0x0;
    local_38 = (BIGNUM *)0x0;
    local_60 = (BIGNUM *)0x0;
    local_58 = pubkeydata;
    local_50 = pubkeydata_len;
    local_48 = method_len;
    EVP_PKEY_get_bn_param(pk,"e",&local_38);
    sVar6 = EVP_PKEY_get_bn_param(pk,"n",&local_60);
    ppuVar1 = local_58;
    if ((local_38 != (BIGNUM *)0x0) && (buf = (uchar *)0x0, local_60 != (BIGNUM *)0x0)) {
      iVar2 = BN_num_bits(local_38);
      iVar4 = iVar2 + 0xe;
      if (-1 < iVar2 + 7) {
        iVar4 = iVar2 + 7;
      }
      iVar3 = BN_num_bits(local_60);
      iVar2 = iVar3 + 0xe;
      if (-1 < iVar3 + 7) {
        iVar2 = iVar3 + 7;
      }
      buf = (uchar *)(*session->alloc)((long)((iVar2 >> 3) + (iVar4 >> 3) + 0x15),&session->abstract
                                      );
      if (buf == (uchar *)0x0) {
        buf = (uchar *)0x0;
        sVar6 = 0;
      }
      else {
        _libssh2_htonu32(buf,7);
        builtin_memcpy(buf + 4,"ssh-rsa",7);
        puVar7 = write_bn(buf + 0xb,(BIGNUM *)local_38,(iVar4 >> 3) + 1);
        puVar7 = write_bn(puVar7,(BIGNUM *)local_60,(iVar2 >> 3) + 1);
        sVar6 = (long)puVar7 - (long)buf;
      }
    }
    if (buf != (uchar *)0x0) {
      builtin_memcpy(puVar5,"ssh-rsa",7);
      *local_40 = puVar5;
      if (local_48 != (size_t *)0x0) {
        *local_48 = 7;
      }
      *ppuVar1 = buf;
      if (local_50 == (size_t *)0x0) {
        return 0;
      }
      *local_50 = sVar6;
      return 0;
    }
  }
  if (puVar5 != (uchar *)0x0) {
    (*session->free)(puVar5,&session->abstract);
  }
  iVar4 = _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  return iVar4;
}

Assistant:

static int
gen_publickey_from_rsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    libssh2_rsa_ctx* rsa = NULL;
    unsigned char *key;
    unsigned char *method_buf = NULL;
    size_t  key_len;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from RSA private key envelope"));

#ifdef USE_OPENSSL_3
    rsa = pk;
#else
    rsa = EVP_PKEY_get1_RSA(pk);
#endif
    if(!rsa) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-rsa. */
    if(!method_buf) {
        goto __alloc_error;
    }

    key = gen_publickey_from_rsa(session, rsa, &key_len);
    if(!key) {
        goto __alloc_error;
    }
#ifndef USE_OPENSSL_3
    RSA_free(rsa);
#endif

    memcpy(method_buf, "ssh-rsa", 7);
    *method = method_buf;
    if(method_len) {
        *method_len = 7;
    }
    *pubkeydata = key;
    if(pubkeydata_len) {
        *pubkeydata_len = key_len;
    }
    return 0;

__alloc_error:
#ifndef USE_OPENSSL_3
    if(rsa) {
        RSA_free(rsa);
    }
#endif
    if(method_buf) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}